

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utIOSystem.cpp
# Opt level: O0

void __thiscall
IOSystemTest_accessDirectoryStackTest_Test::TestBody
          (IOSystemTest_accessDirectoryStackTest_Test *this)

{
  TestIOSystem *pTVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  char *pcVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *in_R9;
  AssertHelper local_240;
  Message local_238;
  undefined8 local_230;
  undefined4 local_224;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__3;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar_2;
  Message local_1a0;
  unsigned_long local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_158;
  Message local_150;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_128 [8];
  string path;
  AssertHelper local_e8;
  Message local_e0;
  allocator local_d1;
  string local_d0 [39];
  bool local_a9;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  Message local_90;
  undefined8 local_88;
  undefined4 local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  IOSystemTest_accessDirectoryStackTest_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  iVar3 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[10])();
  local_21 = (bool)((byte)iVar3 ^ 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_20,
               (AssertionResult *)"pImp->PopDirectory()","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x42,pcVar4);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_7c = 0;
  iVar3 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  local_88 = CONCAT44(extraout_var,iVar3);
  pcVar4 = (char *)0x0;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            ((char *)local_78,"0U",(uint *)"pImp->StackSize()",(unsigned_long *)&local_7c,&local_88)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  pTVar1 = (this->super_IOSystemTest).pImp;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"",&local_d1);
  iVar3 = (*(pTVar1->super_IOSystem)._vptr_IOSystem[7])(pTVar1,local_d0);
  local_a9 = (bool)(~(byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a8,&local_a9,(type *)0x0)
  ;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&path.field_2 + 8),(internal *)local_a8,
               (AssertionResult *)"pImp->PushDirectory( \"\" )","true","false",pcVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x44,pcVar5);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_128,"test/",(allocator *)((long)&gtest_ar__2.message_.ptr_ + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar__2.message_.ptr_ + 7));
  pTVar1 = (this->super_IOSystemTest).pImp;
  iVar3 = (*(pTVar1->super_IOSystem)._vptr_IOSystem[7])(pTVar1,local_128);
  local_141 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(&local_150);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_140,
               (AssertionResult *)"pImp->PushDirectory( path )","false","true",pcVar4);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x46,pcVar5);
    testing::internal::AssertHelper::operator=(&local_158,&local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  local_18c = 1;
  iVar3 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  local_198 = CONCAT44(extraout_var_00,iVar3);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_long>
            ((EqHelper<false> *)local_188,"1U","pImp->StackSize()",&local_18c,&local_198);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
  if (!bVar2) {
    testing::Message::Message(&local_1a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x47,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
  iVar3 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[8])();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((EqHelper<false> *)local_1b8,"path","pImp->CurrentDirectory()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(extraout_var_01,iVar3));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar2) {
    testing::Message::Message(&local_1c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x48,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  iVar3 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[10])();
  local_1d9 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar2) {
    testing::Message::Message(&local_1e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_1d8,
               (AssertionResult *)"pImp->PopDirectory()","false","true",pcVar4);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x49,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_224 = 0;
  iVar3 = (*(((this->super_IOSystemTest).pImp)->super_IOSystem)._vptr_IOSystem[9])();
  local_230 = CONCAT44(extraout_var_02,iVar3);
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_long>
            (local_220,"0U",(uint *)"pImp->StackSize()",(unsigned_long *)&local_224,&local_230);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
  if (!bVar2) {
    testing::Message::Message(&local_238);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
    testing::internal::AssertHelper::AssertHelper
              (&local_240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utIOSystem.cpp"
               ,0x4a,pcVar4);
    testing::internal::AssertHelper::operator=(&local_240,&local_238);
    testing::internal::AssertHelper::~AssertHelper(&local_240);
    testing::Message::~Message(&local_238);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
  std::__cxx11::string::~string((string *)local_128);
  return;
}

Assistant:

TEST_F( IOSystemTest, accessDirectoryStackTest ) {
    EXPECT_FALSE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
    EXPECT_FALSE( pImp->PushDirectory( "" ) );
    std::string path = "test/";
    EXPECT_TRUE( pImp->PushDirectory( path ) );
    EXPECT_EQ( 1U, pImp->StackSize() );
    EXPECT_EQ( path, pImp->CurrentDirectory() );
    EXPECT_TRUE( pImp->PopDirectory() );
    EXPECT_EQ( 0U, pImp->StackSize() );
}